

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

double mjs::to_number(wstring_view *s)

{
  bool bVar1;
  long *plVar2;
  long lVar3;
  wstring_view *local_210;
  wstring_view *local_1d8;
  double d;
  allocator<wchar_t> local_1b9;
  wstring local_1b8 [32];
  wistream local_198 [8];
  wistringstream wis;
  wstring_view *s_local;
  
  bVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::empty(s);
  if (bVar1) {
    return 0.0;
  }
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,void>
            (local_1b8,s,&local_1b9);
  std::__cxx11::wistringstream::basic_istringstream(local_198,local_1b8,8);
  std::__cxx11::wstring::~wstring(local_1b8);
  std::allocator<wchar_t>::~allocator(&local_1b9);
  plVar2 = (long *)std::wistream::operator>>(local_198,(double *)&local_1d8);
  bVar1 = std::wios::operator_cast_to_bool((wios *)((long)plVar2 + *(long *)(*plVar2 + -0x18)));
  if (bVar1) {
    std::__cxx11::wistringstream::rdbuf();
    lVar3 = std::wstreambuf::in_avail();
    if (lVar3 == 0) {
      local_210 = local_1d8;
      goto LAB_001aafa8;
    }
  }
  local_210 = (wstring_view *)0x7ff8000000000000;
LAB_001aafa8:
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)local_198);
  return (double)local_210;
}

Assistant:

double to_number(const std::wstring_view& s) {
    // TODO: Implement real algorithm from §9.3.1 ToNumber Applied to the String Type
    if (s.empty()) {
        return 0;
    }
    std::wistringstream wis{std::wstring{s}};
    double d;
    return (wis >> d) && !wis.rdbuf()->in_avail() ? d : NAN;
}